

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daialg.cpp
# Opt level: O2

vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *
libDAI::calcPairBeliefs
          (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
           *__return_storage_ptr__,InferenceAlgorithm *obj,VarSet *ns,bool reInit)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  ulong uVar5;
  VarSet *this;
  undefined4 extraout_var_00;
  ostream *poVar6;
  pointer pVVar7;
  size_t j_val;
  size_type sVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  size_t k_val;
  ulong uVar12;
  ulong uVar13;
  size_type sVar14;
  ulong uVar15;
  long lVar16;
  size_t k;
  size_type __n;
  size_t j;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> vns;
  double local_f8;
  double local_f0;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> pairbeliefs;
  Complex Z;
  pointer local_b0;
  TFactor<double> local_98;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> facs;
  long *plVar3;
  
  vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __n = (long)(ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
              super__Vector_impl_data._M_start >> 4;
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve(&vns,__n);
  for (pVVar7 = (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar7 != (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_finish; pVVar7 = pVVar7 + 1) {
    std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::push_back(&vns,pVVar7);
  }
  pairbeliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pairbeliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pairbeliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (&pairbeliefs,__n * __n);
  for (sVar14 = 0; sVar14 != __n; sVar14 = sVar14 + 1) {
    lVar17 = 0;
    for (sVar8 = 0; __n != sVar8; sVar8 = sVar8 + 1) {
      if (sVar14 == sVar8) {
        TFactor<double>::TFactor((TFactor<double> *)&Z);
        std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
        emplace_back<libDAI::TFactor<double>>
                  ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                   &pairbeliefs,(TFactor<double> *)&Z);
        TFactor<double>::~TFactor((TFactor<double> *)&Z);
      }
      else {
        VarSet::VarSet(&local_98._vs,
                       vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + sVar14,
                       (Var *)((long)&(vns.
                                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_label + lVar17))
        ;
        TFactor<double>::TFactor((TFactor<double> *)&Z,&local_98._vs);
        std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
        emplace_back<libDAI::TFactor<double>>
                  ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                   &pairbeliefs,(TFactor<double> *)&Z);
        TFactor<double>::~TFactor((TFactor<double> *)&Z);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_98);
      }
      lVar17 = lVar17 + 0x10;
    }
  }
  iVar2 = (**obj->_vptr_InferenceAlgorithm)();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (!reInit) {
    (**(code **)(*plVar3 + 0x70))(plVar3);
  }
  facs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &facs._M_t._M_impl.super__Rb_tree_header._M_header;
  uVar15 = 0;
  facs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  facs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  facs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  facs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       facs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    Z._M_value._0_8_ = uVar15;
    plVar4 = (long *)(**(code **)(*plVar3 + 0x28))(plVar3);
    uVar5 = (**(code **)(*plVar4 + 0x48))(plVar4);
    if (uVar5 <= uVar15) break;
    plVar4 = (long *)(**(code **)(*plVar3 + 0x28))(plVar3);
    this = (VarSet *)(**(code **)(*plVar4 + 0x50))(plVar4,Z._M_value._0_8_);
    bVar1 = VarSet::operator&&(this,ns);
    if (bVar1) {
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&facs,(unsigned_long *)&Z);
    }
    uVar15 = Z._M_value._0_8_ + 1;
  }
  auVar20 = ZEXT816(0);
  for (sVar14 = 0; sVar14 != __n; sVar14 = sVar14 + 1) {
    for (uVar15 = 0; local_f8 = auVar20._8_8_, local_f0 = auVar20._0_8_,
        uVar15 < vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar14]._states; uVar15 = uVar15 + 1) {
      iVar2 = (*obj->_vptr_InferenceAlgorithm[6])();
      if (1 < CONCAT44(extraout_var_00,iVar2)) {
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar6 = std::operator<<(poVar6,"/");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," (");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6,"/");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::operator<<(poVar6,"): ");
      }
      plVar4 = (long *)(**(code **)(*plVar3 + 0x28))(plVar3);
      (**(code **)(*plVar4 + 0x98))
                (plVar4,vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start + sVar14,uVar15,1);
      if (reInit) {
        (**(code **)(*plVar3 + 0x70))(plVar3);
      }
      else {
        (**(code **)(*plVar3 + 0x78))(plVar3,ns);
      }
      (**(code **)(*plVar3 + 0x80))(plVar3);
      if (uVar15 == 0 && sVar14 == 0) {
        auVar20 = (**(code **)(*plVar3 + 0x68))(plVar3);
        pVVar7 = (pointer)0x3ff0000000000000;
      }
      else {
        auVar19 = (**(code **)(*plVar3 + 0x68))(plVar3);
        pVVar7 = (pointer)(auVar19._0_8_ - local_f0);
        local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(auVar19._8_8_ - local_f8);
        auVar18._8_8_ = 0;
        auVar18._0_8_ =
             local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = pVVar7;
        std::exp<double>((complex<double> *)&local_98);
        Z._M_value._8_8_ = auVar18._0_8_;
        auVar19._8_8_ = 0x7fffffffffffffff;
        auVar19._0_8_ = 0x7fffffffffffffff;
        auVar19 = vandpd_avx512vl(auVar18,auVar19);
        Z._M_value._0_8_ = pVVar7;
        if (1e-05 < auVar19._0_8_) {
          poVar6 = std::operator<<((ostream *)&std::cout,"calcPairBelief::  Warning: complex Z: ");
          poVar6 = std::operator<<(poVar6,(complex *)&Z);
          std::endl<char,std::char_traits<char>>(poVar6);
          pVVar7 = (pointer)Z._M_value._0_8_;
        }
      }
      for (sVar8 = 0; sVar8 != __n; sVar8 = sVar8 + 1) {
        if (sVar8 != sVar14) {
          (**(code **)(*plVar3 + 0x50))
                    (&Z,plVar3,
                     vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                     super__Vector_impl_data._M_start + sVar8);
          uVar5 = vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar8]._states;
          for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
            lVar17 = uVar5 * uVar15;
            uVar13 = uVar12;
            if (vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start[sVar14]._label <
                vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start[sVar8]._label) {
              lVar17 = vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar14]._states * uVar12;
              uVar13 = uVar15;
            }
            pairbeliefs.
            super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar14 * __n + sVar8]._p._p.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar13 + lVar17] = (double)pVVar7 * local_b0[uVar12];
          }
          TFactor<double>::~TFactor((TFactor<double> *)&Z);
        }
      }
      plVar4 = (long *)(**(code **)(*plVar3 + 0x28))(plVar3);
      (**(code **)(*plVar4 + 0xb0))(plVar4);
    }
  }
  (**(code **)(*plVar3 + 0x18))(plVar3);
  (__return_storage_ptr__->
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (__return_storage_ptr__,(__n - 1) * __n >> 1);
  lVar9 = __n * 0x38;
  lVar17 = 0x38;
  uVar15 = 0;
  lVar11 = lVar9;
  while (uVar15 != __n) {
    uVar15 = uVar15 + 1;
    lVar10 = lVar11;
    lVar16 = lVar17;
    for (uVar5 = uVar15; uVar5 < __n; uVar5 = uVar5 + 1) {
      TFactor<double>::operator*
                (&local_98,
                 (TFactor<double> *)
                 ((long)&((pairbeliefs.
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar16),
                 (TFactor<double> *)
                 ((long)&((pairbeliefs.
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar10));
      TFactor<double>::operator^((TFactor<double> *)&Z,&local_98,0.5);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                 __return_storage_ptr__,(TFactor<double> *)&Z);
      TFactor<double>::~TFactor((TFactor<double> *)&Z);
      TFactor<double>::~TFactor(&local_98);
      lVar16 = lVar16 + 0x38;
      lVar10 = lVar10 + lVar9;
    }
    lVar17 = lVar17 + lVar9 + 0x38;
    lVar11 = lVar11 + lVar9 + 0x38;
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&facs._M_t);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&pairbeliefs);
  std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
            (&vns.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Factor> calcPairBeliefs( const InferenceAlgorithm & obj, const VarSet& ns, bool reInit ) {
        // convert ns to vector<VarSet>
        size_t N = ns.size();
        std::vector<Var> vns;
        vns.reserve( N );
        for( VarSet::const_iterator n = ns.begin(); n != ns.end(); n++ )
            vns.push_back( *n );

        std::vector<Factor> pairbeliefs;
        pairbeliefs.reserve( N * N );
        for( size_t j = 0; j < N; j++ )
            for( size_t k = 0; k < N; k++ )
                if( j == k )
                    pairbeliefs.push_back(Factor());
                else
                    pairbeliefs.push_back(Factor(vns[j] | vns[k]));

        InferenceAlgorithm *clamped = obj.clone();
        if( !reInit )
            clamped->init();

        std::set<size_t> facs;
        for( size_t I = 0; I < clamped->grm().nrFactors(); I++ )
            if( clamped->grm().factor(I).vars() && ns )
                facs.insert( I );

        Complex logZ0;
        for( size_t j = 0; j < N; j++ ) {
            // clamp Var j to its possible values
            for( size_t j_val = 0; j_val < vns[j].states(); j_val++ ) {
                if( obj.Verbose() >= 2 )
                    std::cout << j << "/" << N-1 << " (" << j_val << "/" << vns[j].states() << "): ";

                clamped->grm().clamp( vns[j], j_val, true );
                if( reInit )
                    clamped->init();
                else
                    clamped->init(ns);
                clamped->run();

                //if( j == 0 )
                //  logZ0 = obj.logZ();
                double Z_xj = 1.0;
                if( j == 0 && j_val == 0 ) {
                    logZ0 = clamped->logZ();
                } else {
                    // subtract logZ0 to avoid very large numbers
                    Complex Z = exp(clamped->logZ() - logZ0);
                    if( fabs(imag(Z)) > 1e-5 )
                        std::cout << "calcPairBelief::  Warning: complex Z: " << Z << std::endl;
                    Z_xj = real(Z);
                }

                for( size_t k = 0; k < N; k++ ) 
                    if( k != j ) {
                        Factor b_k = clamped->belief(vns[k]);
                        for( size_t k_val = 0; k_val < vns[k].states(); k_val++ ) 
                            if( vns[j].label() < vns[k].label() )
                                pairbeliefs[j * N + k][j_val + (k_val * vns[j].states())] = Z_xj * b_k[k_val];
                            else
                                pairbeliefs[j * N + k][k_val + (j_val * vns[k].states())] = Z_xj * b_k[k_val];
                    }

                // restore clamped factors
                clamped->grm().restoreFactors();
            }
        }
        
        delete clamped;

        // Calculate result by taking the geometric average
        std::vector<Factor> result;
        result.reserve( N * (N - 1) / 2 );
        for( size_t j = 0; j < N; j++ )
            for( size_t k = j+1; k < N; k++ )
                result.push_back( (pairbeliefs[j * N + k] * pairbeliefs[k * N + j]) ^ 0.5 );

        return result;
    }